

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcChamferEdgeFeature::IfcChamferEdgeFeature(IfcChamferEdgeFeature *this)

{
  IfcChamferEdgeFeature *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1a8,"IfcChamferEdgeFeature");
  Schema_2x3::IfcEdgeFeature::IfcEdgeFeature
            (&this->super_IfcEdgeFeature,&PTR_construction_vtable_24__00f63a70);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcChamferEdgeFeature,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcChamferEdgeFeature,_2UL> *)
             &(this->super_IfcEdgeFeature).field_0x178,&PTR_construction_vtable_24__00f63c50);
  *(undefined8 *)
   &(this->super_IfcEdgeFeature).super_IfcFeatureElementSubtraction.super_IfcFeatureElement.
    super_IfcElement.super_IfcProduct.super_IfcObject = 0xf638f0;
  *(undefined8 *)&this->field_0x1a8 = 0xf63a58;
  *(undefined8 *)
   &(this->super_IfcEdgeFeature).super_IfcFeatureElementSubtraction.super_IfcFeatureElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x88 = 0xf63918;
  (this->super_IfcEdgeFeature).super_IfcFeatureElementSubtraction.super_IfcFeatureElement.
  super_IfcElement.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0xf63940;
  *(undefined8 *)
   &(this->super_IfcEdgeFeature).super_IfcFeatureElementSubtraction.super_IfcFeatureElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0xd0 = 0xf63968;
  *(undefined8 *)
   &(this->super_IfcEdgeFeature).super_IfcFeatureElementSubtraction.super_IfcFeatureElement.
    super_IfcElement.super_IfcProduct.field_0x100 = 0xf63990;
  *(undefined8 *)
   &(this->super_IfcEdgeFeature).super_IfcFeatureElementSubtraction.super_IfcFeatureElement.
    super_IfcElement.field_0x138 = 0xf639b8;
  *(undefined8 *)
   &(this->super_IfcEdgeFeature).super_IfcFeatureElementSubtraction.super_IfcFeatureElement.
    super_IfcElement.field_0x148 = 0xf639e0;
  *(undefined8 *)
   &(this->super_IfcEdgeFeature).super_IfcFeatureElementSubtraction.super_IfcFeatureElement.
    field_0x158 = 0xf63a08;
  *(undefined8 *)&(this->super_IfcEdgeFeature).field_0x178 = 0xf63a30;
  STEP::Maybe<double>::Maybe((Maybe<double> *)&(this->super_IfcEdgeFeature).field_0x188);
  STEP::Maybe<double>::Maybe(&this->Height);
  return;
}

Assistant:

IfcChamferEdgeFeature() : Object("IfcChamferEdgeFeature") {}